

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O0

void __thiscall Liby::http::RequestParser::clear(RequestParser *this)

{
  string *psVar1;
  RequestParser *this_local;
  
  this->progress_ = 1;
  this->bytes_ = 0;
  (this->super_Request).method_ = 0;
  psVar1 = (string *)std::__cxx11::string::operator=((string *)&(this->super_Request).query_,"");
  std::__cxx11::string::operator=((string *)&(this->super_Request).uri_,psVar1);
  this->http_version_minor_ = 0;
  this->http_version_major_ = 0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->super_Request).headers_);
  return;
}

Assistant:

void RequestParser::clear() {
    progress_ = ParsingMethod;
    bytes_ = 0;
    method_ = INVALID_METHOD;
    uri_ = query_ = "";
    http_version_major_ = http_version_minor_ = 0;
    headers_.clear();
}